

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O0

char * HTTPHeaders_FindHeaderValue(HTTP_HEADERS_HANDLE httpHeadersHandle,char *name)

{
  HTTP_HEADERS_HANDLE_DATA *handleData;
  char *result;
  char *name_local;
  HTTP_HEADERS_HANDLE httpHeadersHandle_local;
  
  if ((httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) || (name == (char *)0x0)) {
    handleData = (HTTP_HEADERS_HANDLE_DATA *)0x0;
  }
  else {
    handleData = (HTTP_HEADERS_HANDLE_DATA *)Map_GetValueFromKey(httpHeadersHandle->headers,name);
  }
  return (char *)handleData;
}

Assistant:

const char* HTTPHeaders_FindHeaderValue(HTTP_HEADERS_HANDLE httpHeadersHandle, const char* name)
{
    const char* result;
    /*Codes_SRS_HTTP_HEADERS_99_022:[ The return value shall be NULL if name parameter is NULL or if httpHeadersHandle is NULL]*/
    if (
        (httpHeadersHandle == NULL) ||
        (name == NULL)
        )
    {
        result = NULL;
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_99_018:[ Calling this API shall retrieve the value for a previously stored name.]*/
        /*Codes_SRS_HTTP_HEADERS_99_020:[ The return value shall be different than NULL when the name matches the name of a previously stored name:value pair.] */
        /*Codes_SRS_HTTP_HEADERS_99_021:[ In this case the return value shall point to a string that shall strcmp equal to the original stored string.]*/
        HTTP_HEADERS_HANDLE_DATA* handleData = (HTTP_HEADERS_HANDLE_DATA*)httpHeadersHandle;
        result = Map_GetValueFromKey(handleData->headers, name);
    }
    return result;

}